

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QDebug operator<<(QDebug dbg,QCborSimpleType st)

{
  int *piVar1;
  long lVar2;
  Stream *pSVar3;
  char *t;
  QDebug *pQVar4;
  QCborSimpleType in_DL;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  
  pQVar4 = (QDebug *)CONCAT71(in_register_00000031,st);
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,pQVar4);
  t = qt_cbor_simpletype_id(in_DL);
  pQVar4->stream->space = false;
  if (t == (char *)0x0) {
    pQVar4 = QDebug::operator<<(pQVar4,"QCborSimpleType(");
    pQVar4 = QDebug::operator<<(pQVar4,(uint)in_DL);
    pQVar4 = QDebug::operator<<(pQVar4,')');
  }
  else {
    pQVar4 = QDebug::operator<<(pQVar4,"QCborSimpleType::");
    pQVar4 = QDebug::operator<<(pQVar4,t);
  }
  pSVar3 = pQVar4->stream;
  ((dbg.stream)->ts)._vptr_QTextStream = (_func_int **)pSVar3;
  piVar1 = &pSVar3->ref;
  *piVar1 = *piVar1 + 1;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return (QDebug)dbg.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, QCborSimpleType st)
{
    QDebugStateSaver saver(dbg);
    const char *id = qt_cbor_simpletype_id(st);
    if (id)
        return dbg.nospace() << "QCborSimpleType::" << id;

    return dbg.nospace() << "QCborSimpleType(" << uint(st) << ')';
}